

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

int stb_ps_writelist(stb_ps *ps,void **list,int size)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  switch((uint)ps & 3) {
  case 0:
    iVar2 = 0;
    if (0 < size && ps != (stb_ps *)0x0) {
      *list = ps;
      iVar2 = 1;
    }
    break;
  case 1:
    lVar3 = 0;
    iVar2 = 0;
    do {
      if (iVar2 < size && *(void **)(ps + lVar3 * 8 + -1) != (void *)0x0) {
        lVar4 = (long)iVar2;
        iVar2 = iVar2 + 1;
        list[lVar4] = *(void **)(ps + lVar3 * 8 + -1);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 2:
    iVar2 = size;
    if (*(int *)(ps + -2) < size) {
      iVar2 = *(int *)(ps + -2);
    }
    memcpy(list,ps + 6,(long)iVar2 << 3);
    break;
  case 3:
    iVar2 = 0;
    if ((0 < size) && (iVar1 = *(int *)(ps + 5), 0 < (long)iVar1)) {
      lVar3 = 0;
      iVar2 = 0;
      do {
        if (((ulong)*(void **)(ps + lVar3 * 8 + 0x1d) & 0xfffffffe) != 0) {
          lVar4 = (long)iVar2;
          iVar2 = iVar2 + 1;
          list[lVar4] = *(void **)(ps + lVar3 * 8 + 0x1d);
          if (iVar2 == size) {
            return size;
          }
        }
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
  }
  return iVar2;
}

Assistant:

int stb_ps_writelist(stb_ps *ps, void **list, int size )
{
   int i,n=0;
   switch (3 & (int) ps) {
      case STB_ps_direct:
         if (ps == NULL || size <= 0) return 0;
         list[0] = ps;
         return 1;
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         for (i=0; i < STB_BUCKET_SIZE; ++i)
            if (b->p[i] != NULL && n < size)
               list[n++] = b->p[i];
         return n;
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         n = stb_min(size, a->count);
         memcpy(list, a->p, sizeof(*list) * n);
         return n;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         if (size <= 0) return 0;
         for (i=0; i < h->count; ++i) {
            if (!stb_ps_empty(h->table[i])) {
               list[n++] = h->table[i];
               if (n == size) break;
            }
         }
         return n;
      }
   }
   return 0; /* NOTREACHED */
}